

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pager.c
# Opt level: O0

int append_str(char *buf,char *new_str,int is_plur)

{
  size_t sVar1;
  char *__src;
  int local_28;
  int space_left;
  int is_plur_local;
  char *new_str_local;
  char *buf_local;
  
  if ((new_str == (char *)0x0) || (*new_str == '\0')) {
    buf_local._4_4_ = 0;
  }
  else {
    sVar1 = strlen(buf);
    local_28 = -(int)sVar1 + 0xff;
    if (*buf != '\0') {
      strncat(buf," on ",(long)local_28);
      local_28 = -(int)sVar1 + 0xfb;
    }
    if (is_plur == 0) {
      __src = an(new_str);
      strncat(buf,__src,(long)local_28);
    }
    else {
      strncat(buf,new_str,(long)local_28);
    }
    buf_local._4_4_ = 1;
  }
  return buf_local._4_4_;
}

Assistant:

static int append_str(char *buf, const char *new_str, int is_plur)
{
    int space_left;	/* space remaining in buf */

    if (!new_str || !new_str[0])
	return 0;
    
    space_left = BUFSZ - strlen(buf) - 1;
    if (buf[0]) {
	strncat(buf, " on ", space_left);
	space_left -= 4;
    }
    
    if (is_plur)
	strncat(buf, new_str, space_left);
    else
	strncat(buf, an(new_str), space_left);
    
    return 1;
}